

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase69::run(TestCase69 *this)

{
  Reader reader_00;
  Builder builder_00;
  size_t sVar1;
  char *pcVar2;
  Type type;
  StringPtr input;
  TextCodec codec;
  ReaderFor<capnproto_test::capnp::test::TestDefaults> structReader;
  String text;
  Orphan<capnproto_test::capnp::test::TestDefaults> orphan;
  MallocMessageBuilder reader;
  MallocMessageBuilder builder;
  TextCodec local_2b1;
  Orphan<capnp::DynamicValue> local_2b0;
  String local_278;
  StructBuilder local_258;
  Orphanage local_230;
  StructBuilder local_220;
  SegmentBuilder *local_1f8;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_2b0,&local_108.super_MessageBuilder);
  local_1f8 = (SegmentBuilder *)local_2b0._0_8_;
  uVar3 = local_2b0.field_1.intValue;
  uVar4 = local_2b0.field_1.listSchema.elementType.field_4;
  PointerBuilder::initStruct(&local_220,(PointerBuilder *)&local_1f8,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)uVar4;
  builder_00._builder.segment = (SegmentBuilder *)uVar3;
  builder_00._builder.data = (void *)in_stack_fffffffffffffe20;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffe28;
  builder_00._builder._32_8_ = in_stack_fffffffffffffe30;
  initTestMessage(builder_00);
  TextCodec::TextCodec(&local_2b1);
  MessageBuilder::getRootInternal((Builder *)&local_2b0,&local_108.super_MessageBuilder);
  local_1f8 = (SegmentBuilder *)local_2b0._0_8_;
  PointerBuilder::getStruct
            (&local_258,(PointerBuilder *)&local_1f8,(StructSize)0x140006,(word *)0x0);
  StructBuilder::asReader(&local_258);
  local_1f8 = (SegmentBuilder *)CONCAT44(local_1f8._4_4_,10);
  TextCodec::encode(&local_278,&local_2b1,(Reader *)&local_1f8);
  DynamicValue::Reader::~Reader((Reader *)&local_1f8);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&local_1f8,0x400,GROW_HEURISTICALLY);
  sVar1 = local_278.content.size_;
  pcVar2 = local_278.content.ptr;
  local_230 = MessageBuilder::getOrphanage((MessageBuilder *)&local_1f8);
  input.content.size_ = sVar1 + (sVar1 == 0);
  if (sVar1 == 0) {
    pcVar2 = "";
  }
  type.field_4.schema = (RawBrandedSchema *)(schemas::s_eb3f9ebe98c73cb6 + 0x48);
  type.baseType = STRUCT;
  type.listDepth = '\0';
  type.isImplicitParam = false;
  type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  type._6_2_ = 0;
  input.content.ptr = pcVar2;
  TextCodec::decode(&local_2b0,&local_2b1,input,type,local_230);
  Orphan<capnp::DynamicValue>::releaseAs<capnproto_test::capnp::test::TestDefaults>
            ((Orphan<capnproto_test::capnp::test::TestDefaults> *)&local_258,&local_2b0);
  if (local_2b0.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_2b0.builder);
  }
  OrphanBuilder::asStructReader
            ((StructReader *)&local_2b0,(OrphanBuilder *)&local_258,(StructSize)0x140006);
  reader_00._reader.capTable = (CapTableReader *)local_2b0.field_1.intValue;
  reader_00._reader.segment = (SegmentReader *)local_2b0._0_8_;
  reader_00._reader.data = (void *)local_2b0.field_1.listSchema.elementType.field_4;
  reader_00._reader.pointers = (WirePointer *)local_2b0.builder.tag.content;
  reader_00._reader._32_8_ = local_2b0.builder.segment;
  reader_00._reader._40_8_ = local_2b0.builder.capTable;
  checkTestMessage(reader_00);
  if (local_258.capTable != (CapTableBuilder *)0x0) {
    OrphanBuilder::euthanize((OrphanBuilder *)&local_258);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&local_1f8);
  sVar1 = local_278.content.size_;
  pcVar2 = local_278.content.ptr;
  if (local_278.content.ptr != (char *)0x0) {
    local_278.content.ptr = (char *)0x0;
    local_278.content.size_ = 0;
    (**(local_278.content.disposer)->_vptr_ArrayDisposer)
              (local_278.content.disposer,pcVar2,1,sVar1,sVar1,0);
  }
  TextCodec::~TextCodec(&local_2b1);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(DynamicApi, Defaults) {
  AlignedData<1> nullRoot = {{0, 0, 0, 0, 0, 0, 0, 0}};
  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(nullRoot.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));
  auto root = reader.getRoot<DynamicStruct>(Schema::from<TestDefaults>());
  checkDynamicTestMessage(root);
}